

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpExtensions.cpp
# Opt level: O0

void __thiscall
GrpTokenStreamFilter::ReportParserError(GrpTokenStreamFilter *this,ParserException *ex)

{
  int iVar1;
  long *in_RSI;
  GrpLineAndFile *in_RDI;
  int nLinePre;
  undefined4 in_stack_fffffffffffffef0;
  int iVar2;
  undefined4 in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  string local_f8 [72];
  string local_b0 [48];
  GrpLineAndFile *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  string local_38 [36];
  int local_14;
  long *local_10;
  
  local_10 = in_RSI;
  local_14 = (**(code **)(*in_RSI + 0x30))();
  if (*(int *)&in_RDI[1].field_0xc < local_14) {
    (**(code **)(*local_10 + 0x28))(local_b0);
    iVar1 = local_14 + *(int *)&in_RDI[1].m_staFile;
    iVar2 = local_14;
    std::__cxx11::string::string(local_f8,(string *)&in_RDI->field_0x10);
    GrpLineAndFile::GrpLineAndFile
              (in_RDI,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
               (string *)CONCAT44(iVar1,iVar2));
    AddGlobalError((bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1e0178);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_b0);
  }
  else {
    (**(code **)(*local_10 + 0x28))(local_38);
    iVar1 = local_14 + *(int *)&in_RDI[2].m_staFile;
    iVar2 = local_14;
    std::__cxx11::string::string((string *)&stack0xffffffffffffff80,(string *)&in_RDI[1].field_0x10)
    ;
    GrpLineAndFile::GrpLineAndFile
              (in_RDI,iVar1,iVar2,
               (string *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    AddGlobalError((bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1e0070);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void GrpTokenStreamFilter::ReportParserError(const ParserException & ex)
{
	int nLinePre = ex.getLine();
	if (nLinePre <= m_nLastLineMarker)
		//	Problematic token was before the last line marker in the pre-processed file.
		AddGlobalError(true, 102, ex.getErrorMessage(),
			GrpLineAndFile(nLinePre, nLinePre + m_nPrevLineOffset, m_staPrevFile));
	else
		AddGlobalError(true, 103, ex.getErrorMessage(),
			GrpLineAndFile(nLinePre, nLinePre + m_nLineOffset, m_staFile));
}